

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O0

void __thiscall CItems::RenderLaser(CItems *this,CNetObj_Laser *pCurrent)

{
  vector2_base<float> vVar1;
  bool bVar2;
  int iVar3;
  IClient *pIVar4;
  IGraphics *pIVar5;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float sy;
  float sx;
  float fVar6;
  vec2 Inner;
  vec2 Outer;
  float RemainingRelativeLifetime;
  float LifetimeMillis;
  vec2 Dir;
  CQuadItem QuadItem;
  vec4 InnerColor;
  CFreeformItem Freeform;
  vec4 OuterColor;
  vec2 From;
  vec2 Pos;
  int aSprites [3];
  vec4 *in_stack_fffffffffffffe68;
  vector2_base<float> *in_stack_fffffffffffffe78;
  vector2_base<float> *this_00;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float nw;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_104;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_100;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_fc;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_f8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_e0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_dc;
  CQuadItem local_c8;
  CQuadItem local_b8;
  uint local_a4;
  CFreeformItem local_a0;
  vector2_base<float> local_80;
  vector4_base<float> local_78;
  CFreeformItem local_68;
  vector2_base<float> local_48;
  vector4_base<float> local_40;
  vector2_base<float> local_30;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_28;
  float local_24;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_20;
  float local_1c;
  undefined8 local_18;
  undefined4 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vector2_base<float>::vector2_base
            ((vector2_base<float> *)&local_20,(float)*in_RSI,(float)in_RSI[1]);
  vector2_base<float>::vector2_base
            ((vector2_base<float> *)&local_28,(float)in_RSI[2],(float)in_RSI[3]);
  local_30 = vector2_base<float>::operator-
                       ((vector2_base<float> *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        in_stack_fffffffffffffe78);
  vVar1 = normalize((vector2_base<float> *)in_stack_fffffffffffffe68);
  if (RenderLaser(CNetObj_Laser_const*)::s_LastGameTick == '\0') {
    iVar3 = __cxa_guard_acquire(&RenderLaser(CNetObj_Laser_const*)::s_LastGameTick);
    if (iVar3 != 0) {
      pIVar4 = CComponent::Client((CComponent *)0x16da4e);
      RenderLaser::s_LastGameTick = IClient::GameTick(pIVar4);
      __cxa_guard_release(&RenderLaser(CNetObj_Laser_const*)::s_LastGameTick);
    }
  }
  if (RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick == '\0') {
    iVar3 = __cxa_guard_acquire(&RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick);
    if (iVar3 != 0) {
      pIVar4 = CComponent::Client((CComponent *)0x16da9f);
      RenderLaser::s_LastIntraTick = IClient::IntraGameTick(pIVar4);
      __cxa_guard_release(&RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick);
    }
  }
  bVar2 = CGameClient::IsWorldPaused(*(CGameClient **)(in_RDI + 8));
  if (!bVar2) {
    pIVar4 = CComponent::Client((CComponent *)0x16daf2);
    RenderLaser::s_LastGameTick = IClient::GameTick(pIVar4);
    pIVar4 = CComponent::Client((CComponent *)0x16db0a);
    RenderLaser::s_LastIntraTick = IClient::IntraGameTick(pIVar4);
  }
  pIVar4 = CComponent::Client((CComponent *)0x16db78);
  iVar3 = IClient::GameTick(pIVar4);
  sy = ((float)(iVar3 - in_RSI[4]) + RenderLaser::s_LastIntraTick) * 1000.0;
  pIVar4 = CComponent::Client((CComponent *)0x16dbb9);
  iVar3 = IClient::GameTickSpeed(pIVar4);
  sx = sy / (float)iVar3;
  fVar6 = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd94));
  nw = 1.0;
  clamp<float>(sx / fVar6,0.0,1.0);
  pIVar5 = CComponent::Graphics((CComponent *)0x16dc41);
  (*(pIVar5->super_IInterface)._vptr_IInterface[8])();
  CComponent::Graphics((CComponent *)0x16dc57);
  IGraphics::TextureClear((IGraphics *)CONCAT44(sx,sy));
  pIVar5 = CComponent::Graphics((CComponent *)0x16dc69);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  vector4_base<float>::vector4_base(&local_40,0.075,0.075,0.25,nw);
  aStack_dc = vVar1.field_1;
  local_e0 = vVar1.field_0;
  this_00 = &local_48;
  vector2_base<float>::vector2_base(this_00,aStack_dc.y,-local_e0.x);
  vVar1 = vector2_base<float>::operator*
                    ((vector2_base<float> *)CONCAT44(nw,in_stack_fffffffffffffe80),
                     (float)((ulong)this_00 >> 0x20));
  CComponent::Graphics((CComponent *)0x16dd09);
  IGraphics::SetColor((IGraphics *)CONCAT44(sx,sy),in_stack_fffffffffffffe68);
  local_fc = vVar1.field_0;
  aStack_f8 = vVar1.field_1;
  IGraphics::CFreeformItem::CFreeformItem
            (&local_68,local_28.x - local_fc.x,local_24 - aStack_f8.y,local_28.x + local_fc.x,
             local_24 + aStack_f8.y,local_20.x - local_fc.x,local_1c - aStack_f8.y,
             local_20.x + local_fc.x,local_1c + aStack_f8.y);
  pIVar5 = CComponent::Graphics((CComponent *)0x16dd9e);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1e])(pIVar5,&local_68);
  vector4_base<float>::vector4_base(&local_78,0.5,0.5,nw,nw);
  vector2_base<float>::vector2_base(&local_80,aStack_dc.y,-local_e0.x);
  vVar1 = vector2_base<float>::operator*
                    ((vector2_base<float> *)CONCAT44(nw,in_stack_fffffffffffffe80),
                     (float)((ulong)this_00 >> 0x20));
  CComponent::Graphics((CComponent *)0x16de40);
  IGraphics::SetColor((IGraphics *)CONCAT44(sx,sy),in_stack_fffffffffffffe68);
  local_104 = vVar1.field_0;
  aStack_100 = vVar1.field_1;
  IGraphics::CFreeformItem::CFreeformItem
            (&local_a0,local_28.x - local_104.x,local_24 - aStack_100.y,local_28.x + local_104.x,
             local_24 + aStack_100.y,local_20.x - local_104.x,local_1c - aStack_100.y,
             local_20.x + local_104.x,local_1c + aStack_100.y);
  local_68.m_X2 = local_a0.m_X2;
  local_68.m_Y2 = local_a0.m_Y2;
  local_68.m_X3 = local_a0.m_X3;
  local_68.m_Y3 = local_a0.m_Y3;
  local_68.m_X0 = local_a0.m_X0;
  local_68.m_Y0 = local_a0.m_Y0;
  local_68.m_X1 = local_a0.m_X1;
  local_68.m_Y1 = local_a0.m_Y1;
  pIVar5 = CComponent::Graphics((CComponent *)0x16def0);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1e])(pIVar5,&local_68,1);
  pIVar5 = CComponent::Graphics((CComponent *)0x16df12);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  pIVar5 = CComponent::Graphics((CComponent *)0x16df2b);
  (*(pIVar5->super_IInterface)._vptr_IInterface[8])();
  pIVar5 = CComponent::Graphics((CComponent *)0x16df41);
  local_a4 = g_pData->m_aImages[3].m_Id.m_Id;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_a4);
  pIVar5 = CComponent::Graphics((CComponent *)0x16df79);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  local_18 = 0x300000002;
  local_10 = 4;
  CComponent::RenderTools((CComponent *)0x16dfaf);
  CRenderTools::SelectSprite
            ((CRenderTools *)CONCAT44(nw,in_stack_fffffffffffffe80),(int)((ulong)this_00 >> 0x20),
             (int)this_00,(int)sx,(int)sy);
  pIVar5 = CComponent::Graphics((CComponent *)0x16dff7);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])((float)RenderLaser::s_LastGameTick);
  CComponent::Graphics((CComponent *)0x16e018);
  IGraphics::SetColor((IGraphics *)CONCAT44(sx,sy),in_stack_fffffffffffffe68);
  IGraphics::CQuadItem::CQuadItem(&local_b8,local_20.x,local_1c,24.0,24.0);
  pIVar5 = CComponent::Graphics((CComponent *)0x16e05e);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_b8,1);
  CComponent::Graphics((CComponent *)0x16e080);
  IGraphics::SetColor((IGraphics *)CONCAT44(sx,sy),in_stack_fffffffffffffe68);
  IGraphics::CQuadItem::CQuadItem(&local_c8,local_20.x,local_1c,20.0,20.0);
  local_b8.m_X = local_c8.m_X;
  local_b8.m_Y = local_c8.m_Y;
  local_b8.m_Width = local_c8.m_Width;
  local_b8.m_Height = local_c8.m_Height;
  pIVar5 = CComponent::Graphics((CComponent *)0x16e0d1);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_b8,1);
  pIVar5 = CComponent::Graphics((CComponent *)0x16e0f3);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  pIVar5 = CComponent::Graphics((CComponent *)0x16e10c);
  (*(pIVar5->super_IInterface)._vptr_IInterface[8])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::RenderLaser(const struct CNetObj_Laser *pCurrent)
{
	const vec2 Pos = vec2(pCurrent->m_X, pCurrent->m_Y);
	const vec2 From = vec2(pCurrent->m_FromX, pCurrent->m_FromY);
	const vec2 Dir = normalize(Pos-From);

	static int s_LastGameTick = Client()->GameTick();
	static float s_LastIntraTick = Client()->IntraGameTick();
	if(!m_pClient->IsWorldPaused())
	{
		s_LastGameTick = Client()->GameTick();
		s_LastIntraTick = Client()->IntraGameTick();
	}

	// This is not using s_LastGameTick because m_StartTick is synchronized by the server
	const float LifetimeMillis = 1000.0f * (Client()->GameTick() - pCurrent->m_StartTick + s_LastIntraTick) / Client()->GameTickSpeed();
	const float RemainingRelativeLifetime = 1.0f - clamp(LifetimeMillis / m_pClient->m_Tuning.m_LaserBounceDelay, 0.0f, 1.0f);

	Graphics()->BlendNormal();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// do outline
	const vec4 OuterColor(0.075f, 0.075f, 0.25f, 1.0f);
	const vec2 Outer = vec2(Dir.y, -Dir.x) * (7.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(OuterColor);
	IGraphics::CFreeformItem Freeform(
			From.x-Outer.x, From.y-Outer.y,
			From.x+Outer.x, From.y+Outer.y,
			Pos.x-Outer.x, Pos.y-Outer.y,
			Pos.x+Outer.x, Pos.y+Outer.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	// do inner
	const vec4 InnerColor(0.5f, 0.5f, 1.0f, 1.0f);
	const vec2 Inner = vec2(Dir.y, -Dir.x) * (5.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(InnerColor);
	Freeform = IGraphics::CFreeformItem(
			From.x-Inner.x, From.y-Inner.y,
			From.x+Inner.x, From.y+Inner.y,
			Pos.x-Inner.x, Pos.y-Inner.y,
			Pos.x+Inner.x, Pos.y+Inner.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	Graphics()->QuadsEnd();

	// render head
	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_PARTICLES].m_Id);
	Graphics()->QuadsBegin();

	const int aSprites[] = { SPRITE_PART_SPLAT01, SPRITE_PART_SPLAT02, SPRITE_PART_SPLAT03 };
	RenderTools()->SelectSprite(aSprites[s_LastGameTick%3]);
	Graphics()->QuadsSetRotation(s_LastGameTick);
	Graphics()->SetColor(OuterColor);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 24, 24);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->SetColor(InnerColor);
	QuadItem = IGraphics::CQuadItem(Pos.x, Pos.y, 20, 20);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();

	Graphics()->BlendNormal();
}